

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O3

uint32_t A64NamedImmMapper_fromString(A64NamedImmMapper *N,char *Name,_Bool *Valid)

{
  char cVar1;
  char *__s1;
  char *pcVar2;
  int iVar3;
  char *__s2;
  ulong uVar4;
  
  if (N->NumPairs != 0) {
    uVar4 = 0;
    do {
      __s1 = N->Pairs[uVar4].Name;
      __s2 = cs_strdup(Name);
      cVar1 = *__s2;
      pcVar2 = __s2;
      while (cVar1 != '\0') {
        iVar3 = tolower((int)cVar1);
        *pcVar2 = (char)iVar3;
        cVar1 = pcVar2[1];
        pcVar2 = pcVar2 + 1;
      }
      iVar3 = strcmp(__s1,__s2);
      (*cs_mem_free)(__s2);
      if (iVar3 == 0) {
        *Valid = true;
        return N->Pairs[uVar4].Value;
      }
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (uVar4 < N->NumPairs);
  }
  *Valid = false;
  return 0xffffffff;
}

Assistant:

uint32_t A64NamedImmMapper_fromString(A64NamedImmMapper *N, char *Name, bool *Valid)
{
	unsigned i;
	for (i = 0; i < N->NumPairs; ++i) {
		if (compare_lower_str(N->Pairs[i].Name, Name)) {
			*Valid = true;
			return N->Pairs[i].Value;
		}
	}

	*Valid = false;
	return (uint32_t)-1;
}